

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadTorus.cpp
# Opt level: O1

void pzgeom::TPZQuadTorus::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  ulong uVar1;
  int iVar2;
  TPZGeoNode *this;
  TPZGeoElRefPattern<pzgeom::TPZQuadTorus> *this_00;
  ulong uVar3;
  double *pdVar4;
  long lVar5;
  TPZManVector<double,_2> loc;
  TPZManVector<long,_4> indexes;
  TPZFNMatrix<12,_double> phitheta;
  TPZManVector<double,_3> xco;
  TPZVec<double> local_3b0;
  double local_390;
  double dStack_388;
  _func_int **local_380;
  TPZVec<long> local_378;
  long local_358 [4];
  TPZManVector<double,_3> local_338;
  TPZFMatrix<double> local_300;
  double local_270 [13];
  TPZManVector<double,_3> local_208;
  TPZQuadTorus local_1d0;
  
  pdVar4 = size->fStore;
  *pdVar4 = 2.0;
  pdVar4[1] = 2.0;
  pdVar4[2] = 1.0;
  local_338.super_TPZVec<double>.fStore = (double *)0x0;
  local_338.super_TPZVec<double>.fNElements = 0;
  local_338.super_TPZVec<double>.fNAlloc = 0;
  local_338.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01841aa0;
  uVar1 = lowercorner->fNElements;
  if ((long)uVar1 < 4) {
    local_338.super_TPZVec<double>.fStore = local_338.fExtAlloc;
    local_338.super_TPZVec<double>.fNAlloc = 0;
  }
  else {
    local_338.super_TPZVec<double>.fStore =
         (double *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    local_338.super_TPZVec<double>.fNAlloc = uVar1;
  }
  if (0 < (long)uVar1) {
    pdVar4 = lowercorner->fStore;
    uVar3 = 0;
    do {
      local_338.super_TPZVec<double>.fStore[uVar3] = pdVar4[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  *local_338.super_TPZVec<double>.fStore = *local_338.super_TPZVec<double>.fStore + 1.0;
  local_300.fElem = local_270;
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 4;
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018aee30;
  local_300.fSize = 0xc;
  local_338.super_TPZVec<double>.fNElements = uVar1;
  local_300.fGiven = local_300.fElem;
  TPZVec<int>::TPZVec(&local_300.fPivot.super_TPZVec<int>,0);
  local_300.fPivot.super_TPZVec<int>.fStore = local_300.fPivot.fExtAlloc;
  local_300.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_300.fPivot.super_TPZVec<int>.fNElements = 0;
  local_300.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_380 = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_300.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_300.fWork.fStore = (double *)0x0;
  local_300.fWork.fNElements = 0;
  local_300.fWork.fNAlloc = 0;
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018aeb40;
  TPZFMatrix<double>::operator=(&local_300,0.0);
  if ((local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *local_300.fElem = 0.0;
  if ((local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
     (local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_300.fElem[1] = 0.0;
  if ((local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_300.fElem[local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow] = 1.0471975511965976;
  if ((local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
     (local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_300.fElem[local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1] = 0.0;
  if ((local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_300.fElem[local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2] =
       1.0471975511965976;
  if ((local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
     (local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_300.fElem[local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2 + 1] =
       3.141592653589793;
  if ((local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 4)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_300.fElem[local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 3] = 0.0;
  if ((1 < local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) &&
     (3 < local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol)) {
    local_300.fElem[local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 3 + 1] =
         3.141592653589793;
    TPZQuadTorus(&local_1d0);
    SetOrigin(&local_1d0,&local_338.super_TPZVec<double>);
    local_1d0.fR = 1.0;
    local_1d0.fr = 0.8;
    TPZFMatrix<double>::operator=(&local_1d0.fPhiTheta.super_TPZFMatrix<double>,&local_300);
    TPZVec<long>::TPZVec(&local_378,0);
    local_378.fStore = local_358;
    local_378._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018a0548;
    local_378.fNElements = 4;
    local_378.fNAlloc = 0;
    pdVar4 = (double *)&DAT_01548c60;
    lVar5 = 0;
    do {
      iVar2 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(&gmesh->fNodeVec);
      local_378.fStore[lVar5] = (long)iVar2;
      TPZManVector<double,_3>::TPZManVector(&local_208,3);
      TPZVec<double>::TPZVec(&local_3b0,0);
      local_3b0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01843b78;
      local_3b0.fStore = &local_390;
      local_3b0.fNElements = 2;
      local_3b0.fNAlloc = 0;
      local_390 = *pdVar4;
      dStack_388 = pdVar4[1];
      X<double>(&local_1d0,&local_300,&local_3b0,&local_208.super_TPZVec<double>);
      this = TPZChunkVector<TPZGeoNode,_10>::operator[]
                       (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,
                        local_378.fStore[lVar5]);
      TPZGeoNode::Initialize(this,&local_208.super_TPZVec<double>,gmesh);
      if (local_3b0.fStore == &local_390) {
        local_3b0.fStore = (double *)0x0;
      }
      local_3b0.fNAlloc = 0;
      local_3b0._vptr_TPZVec = local_380;
      if (local_3b0.fStore != (double *)0x0) {
        operator_delete__(local_3b0.fStore);
      }
      TPZManVector<double,_3>::~TPZManVector(&local_208);
      lVar5 = lVar5 + 1;
      pdVar4 = pdVar4 + 2;
    } while (lVar5 != 4);
    this_00 = (TPZGeoElRefPattern<pzgeom::TPZQuadTorus> *)operator_new(0x2e0);
    TPZGeoElRefPattern<pzgeom::TPZQuadTorus>::TPZGeoElRefPattern(this_00,&local_378,matid,gmesh);
    SetOrigin(&(this_00->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>).fGeo,
              &local_338.super_TPZVec<double>);
    (this_00->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>).fGeo.fR = 1.0;
    (this_00->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>).fGeo.fr = 0.8;
    TPZFMatrix<double>::operator=
              (&(this_00->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>).fGeo.fPhiTheta.
                super_TPZFMatrix<double>,&local_300);
    if (local_378.fStore == local_358) {
      local_378.fStore = (long *)0x0;
    }
    local_378.fNAlloc = 0;
    local_378._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
    if (local_378.fStore != (long *)0x0) {
      operator_delete__(local_378.fStore);
    }
    local_1d0.super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.
    super_TPZQuadrilateral.super_TPZSavable._vptr_TPZSavable =
         (TPZSavable)&PTR__TPZQuadTorus_018c4a20;
    TPZFMatrix<double>::~TPZFMatrix(&local_1d0.fPhiTheta.super_TPZFMatrix<double>,&PTR_PTR_018aedf8)
    ;
    TPZManVector<double,_10>::~TPZManVector(&local_1d0.fOrigin);
    TPZFMatrix<double>::~TPZFMatrix(&local_300,&PTR_PTR_018aedf8);
    TPZManVector<double,_3>::~TPZManVector(&local_338);
    return;
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void pzgeom::TPZQuadTorus::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
    {
        REAL R = 1., r = 0.8;
        size[0] = 2.;
        size[1] = 2.;
        size[2] = 1.;
        TPZManVector<REAL,3> origin(lowercorner);
        origin[0] += 1.;        
        TPZFNMatrix<12,REAL> phitheta(2,4,0.);
        phitheta(0,0) = 0.;
        phitheta(1,0) = 0;
        
        phitheta(0,1) = M_PI/3;
        phitheta(1,1) = 0;
        
        phitheta(0,2) = M_PI/3;
        phitheta(1,2) = M_PI;
        
        phitheta(0,3) = 0.;
        phitheta(1,3) = M_PI;

        TPZQuadTorus torus;
        torus.SetOrigin(origin);
        torus.SetDataRadius(R, r);
        torus.SetDataPhiTheta(phitheta);
        TPZManVector<int64_t,4> indexes(4);
        constexpr REAL coords[4][2] = {
            {-1,-1},{1,-1},{1,1},{-1,1}
        };
        for (int i=0; i<4; i++) {
            indexes[i] = gmesh.NodeVec().AllocateNewElement();
            TPZManVector<REAL,3> xco(3);
            TPZManVector<REAL, 2>loc(2);
            loc[0] = coords[i][0];
            loc[1] = coords[i][1];
            torus.X(phitheta, loc, xco);
            gmesh.NodeVec()[indexes[i]].Initialize(xco, gmesh);
        }
        TPZGeoElRefPattern<pzgeom::TPZQuadTorus> *gel = new TPZGeoElRefPattern<pzgeom::TPZQuadTorus>(indexes,matid,gmesh);
        gel->Geom().SetOrigin(origin);
        gel->Geom().SetDataRadius(R, r);
        gel->Geom().SetDataPhiTheta(phitheta);
    }